

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.h
# Opt level: O2

TerExpr * __thiscall
SQCompilation::SQParser::
newNode<SQCompilation::TerExpr,SQCompilation::Expr*,SQCompilation::Expr*,SQCompilation::Expr*>
          (SQParser *this,Expr *args,Expr *args_1,Expr *args_2)

{
  TerExpr *this_00;
  
  this_00 = (TerExpr *)Arena::allocatePull(this->_astArena,0x38);
  TerExpr::TerExpr(this_00,args,args_1,args_2);
  return this_00;
}

Assistant:

N *newNode(Args... args) {
        return new (arena()) N(args...);
    }